

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  initializer_list<std::tuple<unsigned_long,_unsigned_int>_> __l;
  initializer_list<std::tuple<unsigned_long,_unsigned_int>_> __l_00;
  initializer_list<std::tuple<unsigned_long,_unsigned_int>_> __l_01;
  initializer_list<std::tuple<unsigned_long,_unsigned_int>_> __l_02;
  initializer_list<VcdGen::Signal_*> __l_03;
  allocator<std::tuple<unsigned_long,_unsigned_int>_> local_5b9;
  int local_5b8 [8];
  tuple<unsigned_long,_unsigned_int> local_598;
  tuple<unsigned_long,_unsigned_int> local_588;
  tuple<unsigned_long,_unsigned_int> local_578;
  tuple<unsigned_long,_unsigned_int> local_568;
  tuple<unsigned_long,_unsigned_int> *local_558;
  size_type local_550;
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_548;
  allocator<std::tuple<unsigned_long,_unsigned_int>_> local_529;
  int local_528 [8];
  tuple<unsigned_long,_unsigned_int> local_508;
  tuple<unsigned_long,_unsigned_int> local_4f8;
  tuple<unsigned_long,_unsigned_int> local_4e8;
  tuple<unsigned_long,_unsigned_int> local_4d8;
  tuple<unsigned_long,_unsigned_int> *local_4c8;
  size_type local_4c0;
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_4b8;
  allocator<std::tuple<unsigned_long,_unsigned_int>_> local_499;
  int local_498 [8];
  tuple<unsigned_long,_unsigned_int> local_478;
  tuple<unsigned_long,_unsigned_int> local_468;
  tuple<unsigned_long,_unsigned_int> local_458;
  tuple<unsigned_long,_unsigned_int> local_448;
  tuple<unsigned_long,_unsigned_int> *local_438;
  size_type local_430;
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_428;
  allocator<std::tuple<unsigned_long,_unsigned_int>_> local_409;
  int local_408 [8];
  tuple<unsigned_long,_unsigned_int> local_3e8;
  tuple<unsigned_long,_unsigned_int> local_3d8;
  tuple<unsigned_long,_unsigned_int> local_3c8;
  tuple<unsigned_long,_unsigned_int> local_3b8;
  tuple<unsigned_long,_unsigned_int> *local_3a8;
  size_type local_3a0;
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_398;
  allocator<VcdGen::Signal_*> local_379;
  Signal *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  iterator local_360;
  size_type local_358;
  vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_> local_350;
  allocator<char> local_331;
  string local_330;
  undefined1 local_310 [8];
  Signal dummy;
  string local_2c0;
  undefined1 local_2a0 [8];
  Signal wr_en;
  string local_250;
  undefined1 local_230 [8];
  Signal valid;
  string local_1e0;
  undefined1 local_1c0 [8];
  Signal data;
  string local_170;
  undefined1 local_150 [8];
  Module SubMod;
  string local_f8;
  undefined1 local_d8 [8];
  Module Logic;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  VcdGenerator gen;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"test_001.vcd",&local_71);
  VcdGen::VcdGenerator::VcdGenerator((VcdGenerator *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Logic",
             (allocator<char> *)
             ((long)&SubMod.sub_modules_.
                     super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  VcdGen::Module::Module((Module *)local_d8,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&SubMod.sub_modules_.
                     super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"SubMod",
             (allocator<char> *)(data.encoded_name_.field_2._M_local_buf + 0xf));
  VcdGen::Module::Module((Module *)local_150,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator
            ((allocator<char> *)(data.encoded_name_.field_2._M_local_buf + 0xf));
  VcdGen::Module::add_submodule((Module *)local_d8,(Module *)local_150);
  VcdGen::VcdGenerator::set_top_level_module((VcdGenerator *)local_50,(Module *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"data",
             (allocator<char> *)(valid.encoded_name_.field_2._M_local_buf + 0xf));
  VcdGen::Signal::Signal((Signal *)local_1c0,&local_1e0,8);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(valid.encoded_name_.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"valid",
             (allocator<char> *)(wr_en.encoded_name_.field_2._M_local_buf + 0xf));
  VcdGen::Signal::Signal((Signal *)local_230,&local_250,1);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator
            ((allocator<char> *)(wr_en.encoded_name_.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"wr_en",
             (allocator<char> *)(dummy.encoded_name_.field_2._M_local_buf + 0xf));
  VcdGen::Signal::Signal((Signal *)local_2a0,&local_2c0,1);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(dummy.encoded_name_.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"dummy",&local_331);
  VcdGen::Signal::Signal((Signal *)local_310,&local_330,0x10);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  local_378 = (Signal *)local_1c0;
  local_370 = local_230;
  local_368 = local_2a0;
  local_360 = &local_378;
  local_358 = 3;
  std::allocator<VcdGen::Signal_*>::allocator(&local_379);
  __l_03._M_len = local_358;
  __l_03._M_array = local_360;
  std::vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>::vector
            (&local_350,__l_03,&local_379);
  VcdGen::Module::add_signal((Module *)local_150,&local_350);
  std::vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>::~vector(&local_350);
  std::allocator<VcdGen::Signal_*>::~allocator(&local_379);
  VcdGen::Module::add_signal((Module *)local_d8,(Signal *)local_310);
  local_408[7] = 0;
  local_408[6] = 0;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>
            (&local_3e8,local_408 + 7,local_408 + 6);
  local_408[5] = 100;
  local_408[4] = 0x55;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>
            (&local_3d8,local_408 + 5,local_408 + 4);
  local_408[3] = 0x6e;
  local_408[2] = 0;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>
            (&local_3c8,local_408 + 3,local_408 + 2);
  local_408[1] = 0x96;
  local_408[0] = 0;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>(&local_3b8,local_408 + 1,local_408)
  ;
  local_3a0 = 4;
  local_3a8 = &local_3e8;
  std::allocator<std::tuple<unsigned_long,_unsigned_int>_>::allocator(&local_409);
  __l_02._M_len = local_3a0;
  __l_02._M_array = local_3a8;
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector(&local_398,__l_02,&local_409);
  VcdGen::Signal::value_at((Signal *)local_1c0,&local_398);
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::~vector(&local_398);
  std::allocator<std::tuple<unsigned_long,_unsigned_int>_>::~allocator(&local_409);
  local_498[7] = 0;
  local_498[6] = 0;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>
            (&local_478,local_498 + 7,local_498 + 6);
  local_498[5] = 100;
  local_498[4] = 1;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>
            (&local_468,local_498 + 5,local_498 + 4);
  local_498[3] = 0x6e;
  local_498[2] = 0;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>
            (&local_458,local_498 + 3,local_498 + 2);
  local_498[1] = 0x96;
  local_498[0] = 0;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>(&local_448,local_498 + 1,local_498)
  ;
  local_430 = 4;
  local_438 = &local_478;
  std::allocator<std::tuple<unsigned_long,_unsigned_int>_>::allocator(&local_499);
  __l_01._M_len = local_430;
  __l_01._M_array = local_438;
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector(&local_428,__l_01,&local_499);
  VcdGen::Signal::value_at((Signal *)local_230,&local_428);
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::~vector(&local_428);
  std::allocator<std::tuple<unsigned_long,_unsigned_int>_>::~allocator(&local_499);
  local_528[7] = 0;
  local_528[6] = 0;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>
            (&local_508,local_528 + 7,local_528 + 6);
  local_528[5] = 100;
  local_528[4] = 1;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>
            (&local_4f8,local_528 + 5,local_528 + 4);
  local_528[3] = 0x6e;
  local_528[2] = 0;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>
            (&local_4e8,local_528 + 3,local_528 + 2);
  local_528[1] = 0x96;
  local_528[0] = 0;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>(&local_4d8,local_528 + 1,local_528)
  ;
  local_4c0 = 4;
  local_4c8 = &local_508;
  std::allocator<std::tuple<unsigned_long,_unsigned_int>_>::allocator(&local_529);
  __l_00._M_len = local_4c0;
  __l_00._M_array = local_4c8;
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector(&local_4b8,__l_00,&local_529);
  VcdGen::Signal::value_at((Signal *)local_2a0,&local_4b8);
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::~vector(&local_4b8);
  std::allocator<std::tuple<unsigned_long,_unsigned_int>_>::~allocator(&local_529);
  local_5b8[7] = 0;
  local_5b8[6] = 0;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>
            (&local_598,local_5b8 + 7,local_5b8 + 6);
  local_5b8[5] = 100;
  local_5b8[4] = 0xb;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>
            (&local_588,local_5b8 + 5,local_5b8 + 4);
  local_5b8[3] = 0x6e;
  local_5b8[2] = 0;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>
            (&local_578,local_5b8 + 3,local_5b8 + 2);
  local_5b8[1] = 0x96;
  local_5b8[0] = 0;
  std::tuple<unsigned_long,_unsigned_int>::tuple<int,_int,_true>(&local_568,local_5b8 + 1,local_5b8)
  ;
  local_550 = 4;
  local_558 = &local_598;
  std::allocator<std::tuple<unsigned_long,_unsigned_int>_>::allocator(&local_5b9);
  __l._M_len = local_550;
  __l._M_array = local_558;
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector(&local_548,__l,&local_5b9);
  VcdGen::Signal::value_at((Signal *)local_310,&local_548);
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::~vector(&local_548);
  std::allocator<std::tuple<unsigned_long,_unsigned_int>_>::~allocator(&local_5b9);
  VcdGen::VcdGenerator::operator()((VcdGenerator *)local_50);
  VcdGen::Signal::~Signal((Signal *)local_310);
  VcdGen::Signal::~Signal((Signal *)local_2a0);
  VcdGen::Signal::~Signal((Signal *)local_230);
  VcdGen::Signal::~Signal((Signal *)local_1c0);
  VcdGen::Module::~Module((Module *)local_150);
  VcdGen::Module::~Module((Module *)local_d8);
  VcdGen::VcdGenerator::~VcdGenerator((VcdGenerator *)local_50);
  return 0;
}

Assistant:

int main()
{

    // Single instance which generates the VCD
    VcdGen::VcdGenerator gen("test_001.vcd");

    // Hierachy contains modules
    VcdGen::Module Logic {"Logic"};
    VcdGen::Module SubMod {"SubMod"};

    // Modules can be heirarchical
    Logic.add_submodule( &SubMod ) ;

    // Connect things up
    gen.set_top_level_module( &Logic );
    
    // Create Signals : format Signal var{Name, Width};
    VcdGen::Signal data  { "data"  , 8  };
    VcdGen::Signal valid { "valid" , 1  };
    VcdGen::Signal wr_en { "wr_en" , 1  };
    VcdGen::Signal dummy { "dummy" , 16 };

    // Add Signals to the module / submodule
    SubMod.add_signal( {&data, &valid, &wr_en} );
    Logic.add_signal( &dummy );

    // Set values for the signals
    data.value_at(  {{0, 0}, {100, 85}, {110, 0}, {150, 0}} );
    valid.value_at( {{0, 0}, {100, 1} , {110, 0}, {150, 0}} );
    wr_en.value_at( {{0, 0}, {100, 1} , {110, 0}, {150, 0}} );
    dummy.value_at( {{0, 0}, {100, 11}, {110, 0}, {150, 0}} );
    
    gen();
}